

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

void Curl_infof(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *format;
  size_t maxlength;
  char *buffer;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char print_buffer [2049];
  __va_list_tag local_8e8;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2044];
  char local_1c;
  char local_1b [11];
  
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x87b & 0x40) != 0)) {
    local_8e8.gp_offset = 0x10;
    local_8e8.fp_offset = 0x30;
    local_8e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_8e8.reg_save_area = local_8c8;
    local_8b8 = in_RDX;
    local_8b0 = in_RCX;
    local_8a8 = in_R8;
    local_8a0 = in_R9;
    uVar1 = curl_mvsnprintf(local_818,0x801,fmt,&local_8e8);
    if (0x800 < uVar1) {
      sVar2 = strlen(fmt);
      if (fmt[sVar2 - 1] == '\n') {
        buffer = &local_1c;
        format = "...\n";
        maxlength = 5;
      }
      else {
        buffer = local_1b;
        format = "...";
        maxlength = 4;
      }
      curl_msnprintf(buffer,maxlength,format);
    }
    sVar2 = strlen(local_818);
    Curl_debug(data,CURLINFO_TEXT,local_818,sVar2);
  }
  return;
}

Assistant:

void Curl_infof(struct Curl_easy *data, const char *fmt, ...)
{
  if(data && data->set.verbose) {
    va_list ap;
    size_t len;
    char print_buffer[2048 + 1];
    va_start(ap, fmt);
    len = mvsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    /*
     * Indicate truncation of the input by replacing the last 3 characters
     * with "...", and transfer the newline over in case the format had one.
     */
    if(len >= sizeof(print_buffer)) {
      len = strlen(fmt);
      if(fmt[--len] == '\n')
        msnprintf(print_buffer + (sizeof(print_buffer) - 5), 5, "...\n");
      else
        msnprintf(print_buffer + (sizeof(print_buffer) - 4), 4, "...");
    }
    va_end(ap);
    len = strlen(print_buffer);
    Curl_debug(data, CURLINFO_TEXT, print_buffer, len);
  }
}